

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

string * __thiscall
DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_
          (string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 1) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(int *)(lVar4 + 0x20) == 0;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 2)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 2) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 2;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 3)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 4) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 4;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 5)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x40) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 0x40;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x41)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  uVar5 = (uint)this;
  if ((uVar5 >> 9 & 1) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 0x200;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x201)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar5 >> 0x11 & 1) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 0x20000;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x20001)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar5 >> 0x12 & 1) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 0x40000;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x40001)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar5 >> 0x13 & 1) != 0) {
    if (pixel_format_flag_names_abi_cxx11_._16_8_ == 0) {
      lVar4 = 0x143388;
    }
    else {
      lVar2 = 0x143388;
      lVar4 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar6 = *(uint *)(lVar4 + 0x20) < 0x80000;
        if (!bVar6) {
          lVar2 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar6 * 8);
      } while (lVar4 != 0);
      lVar4 = 0x143388;
      if ((lVar2 != 0x143388) && (lVar4 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x80001)) {
        lVar4 = lVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar4 + 0x28),
               *(long *)(lVar4 + 0x30) + *(long *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    uVar3 = (ulong)((int)__return_storage_ptr__->_M_string_length - 1);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (pcVar1[uVar3] == '|') {
      __return_storage_ptr__->_M_string_length = uVar3;
      pcVar1[uVar3] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrintPixelFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,pixel_format_flag_names)
    #include "defs/dds/pixel_format_flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }